

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O0

Request<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
* __thiscall
capnproto_test::capnp::test::TestMoreStuff::Client::callFooRequest
          (Request<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
           *__return_storage_ptr__,Client *this,Maybe<capnp::MessageSize> *sizeHint)

{
  long lVar1;
  Maybe<capnp::MessageSize> local_38;
  Maybe<capnp::MessageSize> *local_20;
  Maybe<capnp::MessageSize> *sizeHint_local;
  Client *this_local;
  
  lVar1 = *(long *)(*(long *)this + -0x18);
  local_20 = sizeHint;
  sizeHint_local = (Maybe<capnp::MessageSize> *)this;
  this_local = (Client *)__return_storage_ptr__;
  kj::Maybe<capnp::MessageSize>::Maybe(&local_38,sizeHint);
  ::capnp::Capability::Client::
  newCall<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
            (__return_storage_ptr__,(Client *)(&this->field_0x0 + lVar1),0xddc70bf9784133cf,0,
             &local_38,(CallHints)0x1);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_38);
  return __return_storage_ptr__;
}

Assistant:

::capnp::Request< ::capnproto_test::capnp::test::TestMoreStuff::CallFooParams,  ::capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
TestMoreStuff::Client::callFooRequest(::kj::Maybe< ::capnp::MessageSize> sizeHint) {
  return newCall< ::capnproto_test::capnp::test::TestMoreStuff::CallFooParams,  ::capnproto_test::capnp::test::TestMoreStuff::CallFooResults>(
      0xddc70bf9784133cfull, 0, sizeHint, {true});
}